

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O1

void voutlet_dspepilog(_voutlet *x,t_signal **parentsigs,int myvecsize,int calcsize,int phase,
                      int period,int frequency,int downsample,int upsample,int reblock,int switched)

{
  size_t nbytes;
  int iVar1;
  t_sample *ptVar2;
  t_sample *ptVar3;
  uint method;
  uint uVar4;
  int iVar5;
  int local_6c;
  t_signal *local_68;
  
  if (x->x_buf != (t_sample *)0x0) {
    (x->x_updown).downsample = downsample;
    (x->x_updown).upsample = upsample;
    if (reblock == 0) {
      if (parentsigs != (t_signal **)0x0 && switched != 0) {
        iVar1 = outlet_getsignalindex(x->x_parentoutlet);
        dsp_add_zero(parentsigs[iVar1]->s_vec,parentsigs[iVar1]->s_n);
        return;
      }
    }
    else {
      if (parentsigs == (t_signal **)0x0) {
        iVar1 = 1;
        local_68 = (t_signal *)0x0;
        local_6c = 1;
      }
      else {
        iVar1 = outlet_getsignalindex(x->x_parentoutlet);
        local_68 = parentsigs[iVar1];
        local_6c = local_68->s_vecsize;
        iVar1 = (local_6c * upsample) / downsample;
      }
      uVar4 = myvecsize / iVar1 + -1 + (uint)(myvecsize / iVar1 == 0);
      if (myvecsize < iVar1) {
        myvecsize = iVar1;
      }
      if (myvecsize != x->x_bufsize) {
        freebytes(x->x_buf,(long)x->x_bufsize << 2);
        nbytes = (long)myvecsize * 4;
        ptVar2 = (t_sample *)getbytes(nbytes);
        memset(ptVar2,0,nbytes);
        x->x_bufsize = myvecsize;
        x->x_endbuf = ptVar2 + myvecsize;
        x->x_buf = ptVar2;
      }
      iVar5 = iVar1 * period;
      if (myvecsize < iVar5) {
        bug("voutlet_dspepilog");
      }
      ptVar2 = x->x_buf;
      ptVar3 = ptVar2 + (int)((-period & (phase + period) - 1U & uVar4) * iVar1);
      if (ptVar2 + (int)((-period & (phase + period) - 1U & uVar4) * iVar1) == x->x_endbuf) {
        ptVar3 = ptVar2;
      }
      x->x_write = ptVar3;
      if (1 < frequency && period == 1) {
        iVar5 = iVar1 / frequency;
      }
      x->x_hop = iVar5;
      if (parentsigs != (t_signal **)0x0) {
        x->x_empty = ptVar2 + (int)((uVar4 & phase) * iVar1);
        if (upsample * downsample == 1) {
          dsp_add(voutlet_doepilog,3,x,local_68->s_vec,(long)iVar1);
          return;
        }
        uVar4 = (x->x_updown).method;
        method = (uint)(0x2b < pd_compatibilitylevel);
        if (-1 < (int)uVar4) {
          method = uVar4;
        }
        dsp_add(voutlet_doepilog_resampling,2,x,(long)iVar1);
        resampleto_dsp(&x->x_updown,local_68->s_vec,iVar1,local_6c,method);
        return;
      }
    }
  }
  return;
}

Assistant:

void voutlet_dspepilog(struct _voutlet *x, t_signal **parentsigs,
    int myvecsize, int calcsize, int phase, int period, int frequency,
    int downsample, int upsample, int reblock, int switched)
{
    if (!x->x_buf) return;  /* this shouldn't be necesssary... */
    x->x_updown.downsample=downsample;
    x->x_updown.upsample=upsample;
    if (reblock)
    {
        t_signal *outsig;
        int parentvecsize, bufsize, oldbufsize;
        int re_parentvecsize;
        int bigperiod, epilogphase, blockphase;
        if (parentsigs)
        {
            outsig = parentsigs[outlet_getsignalindex(x->x_parentoutlet)];
            parentvecsize = outsig->s_vecsize;
            re_parentvecsize = parentvecsize * upsample / downsample;
        }
        else
        {
            outsig = 0;
            parentvecsize = 1;
            re_parentvecsize = 1;
        }
        bigperiod = myvecsize/re_parentvecsize;
        if (!bigperiod) bigperiod = 1;
        epilogphase = phase & (bigperiod - 1);
        blockphase = (phase + period - 1) & (bigperiod - 1) & (- period);
        bufsize = re_parentvecsize;
        if (bufsize < myvecsize) bufsize = myvecsize;
        if (bufsize != (oldbufsize = x->x_bufsize))
        {
            t_sample *buf = x->x_buf;
            t_freebytes(buf, oldbufsize * sizeof(*buf));
            buf = (t_sample *)t_getbytes(bufsize * sizeof(*buf));
            memset((char *)buf, 0, bufsize * sizeof(*buf));
            x->x_bufsize = bufsize;
            x->x_endbuf = buf + bufsize;
            x->x_buf = buf;
        }
        if (re_parentvecsize * period > bufsize) bug("voutlet_dspepilog");
        x->x_write = x->x_buf + re_parentvecsize * blockphase;
        if (x->x_write == x->x_endbuf) x->x_write = x->x_buf;
        if (period == 1 && frequency > 1)
            x->x_hop = re_parentvecsize / frequency;
        else x->x_hop = period * re_parentvecsize;
        /* post("phase %d, block %d, parent %d", phase & 63,
            parentvecsize * blockphase, parentvecsize * epilogphase); */
        if (parentsigs)
        {
            /* set epilog pointer and schedule it */
            x->x_empty = x->x_buf + re_parentvecsize * epilogphase;
            if (upsample * downsample == 1)
                dsp_add(voutlet_doepilog, 3, x, outsig->s_vec,
                    (t_int)re_parentvecsize);
            else
            {
                int method = (x->x_updown.method < 0 ?
                    (pd_compatibilitylevel < 44 ? 0 : 1) : x->x_updown.method);
                dsp_add(voutlet_doepilog_resampling, 2, x, (t_int)re_parentvecsize);
                resampleto_dsp(&x->x_updown, outsig->s_vec, re_parentvecsize,
                    parentvecsize, method);
            }
        }
    }
        /* if we aren't blocked but we are switched, the epilog code just
        copies zeros to the output.  In this case the blocking code actually
        jumps over the epilog if the block is running. */
    else if (switched)
    {
        if (parentsigs)
        {
            t_signal *outsig =
                parentsigs[outlet_getsignalindex(x->x_parentoutlet)];
            dsp_add_zero(outsig->s_vec, outsig->s_n);
        }
    }
}